

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

double __thiscall Matrix::GetFrobeniusNorm(Matrix *this)

{
  bool bVar1;
  reference this_00;
  double dVar2;
  Fraction local_60;
  reference local_58;
  Fraction *item;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Fraction,_std::allocator<Fraction>_> *__range2;
  vector<Fraction,_std::allocator<Fraction>_> *row;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
  *__range1;
  Fraction result;
  Matrix *this_local;
  
  result = (Fraction)this;
  Fraction::Fraction((Fraction *)&__range1);
  __end1 = std::
           vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
           ::begin(&this->elements_);
  row = (vector<Fraction,_std::allocator<Fraction>_> *)
        std::
        vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>
        ::end(&this->elements_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_std::vector<Fraction,_std::allocator<Fraction>_>_*,_std::vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>_>
                                *)&row);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::vector<Fraction,_std::allocator<Fraction>_>_*,_std::vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>_>
              ::operator*(&__end1);
    __end2 = std::vector<Fraction,_std::allocator<Fraction>_>::begin(this_00);
    item = (Fraction *)std::vector<Fraction,_std::allocator<Fraction>_>::end(this_00);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_Fraction_*,_std::vector<Fraction,_std::allocator<Fraction>_>_>
                                  *)&item);
      if (!bVar1) break;
      local_58 = __gnu_cxx::
                 __normal_iterator<const_Fraction_*,_std::vector<Fraction,_std::allocator<Fraction>_>_>
                 ::operator*(&__end2);
      local_60 = operator*(local_58,local_58);
      Fraction::operator+=((Fraction *)&__range1,&local_60);
      __gnu_cxx::
      __normal_iterator<const_Fraction_*,_std::vector<Fraction,_std::allocator<Fraction>_>_>::
      operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<const_std::vector<Fraction,_std::allocator<Fraction>_>_*,_std::vector<std::vector<Fraction,_std::allocator<Fraction>_>,_std::allocator<std::vector<Fraction,_std::allocator<Fraction>_>_>_>_>
    ::operator++(&__end1);
  }
  dVar2 = Fraction::ToDouble((Fraction *)&__range1);
  dVar2 = sqrt(dVar2);
  return dVar2;
}

Assistant:

double Matrix::GetFrobeniusNorm() const {
    Fraction result;
    for (const auto& row : elements_) {
        for (const auto& item : row) {
            result += item * item;
        }
    }

    return sqrt(result.ToDouble());
}